

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRational.cpp
# Opt level: O1

void __thiscall Imf_2_5::Rational::Rational(Rational *this,double x)

{
  int iVar1;
  double dVar2;
  
  iVar1 = 1;
  if (x < 0.0) {
    if (0.0 <= x) {
      this->n = 0;
      this->d = 0;
      return;
    }
    x = -x;
    iVar1 = -1;
  }
  if (2147483647.5 <= x) {
    this->n = iVar1;
    this->d = 0;
  }
  else {
    dVar2 = 1.0;
    if (1.0 <= x) {
      dVar2 = x;
    }
    dVar2 = anon_unknown_1::denom(x,dVar2 * 9.313225746154785e-10);
    this->d = (uint)(long)dVar2;
    dVar2 = floor((double)((long)dVar2 & 0xffffffff) * x + 0.5);
    this->n = iVar1 * (int)dVar2;
  }
  return;
}

Assistant:

Rational::Rational (double x)
{
    int sign;

    if (x >= 0)
    {
	sign = 1;	// positive
    }
    else if (x < 0)
    {
	sign = -1;	// negative
	x = -x;
    }
    else
    {
	n = 0;		// NaN
	d = 0;
	return;
    }

    if (x >= (1U << 31) - 0.5)
    {
	n = sign;	// infinity
	d = 0;
	return;
    }

    double e = (x < 1? 1: x) / (1U << 30);
    d = (unsigned int) denom (x, e);
    n = sign * (int) floor (x * d + 0.5);
}